

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_tell.c
# Opt level: O2

zip_int64_t zip_source_tell(zip_source_t *src)

{
  zip_int64_t zVar1;
  int se;
  int ze;
  
  if (src->source_closed == false) {
    if (src->open_count == 0) {
      ze = 0x12;
      se = 0;
    }
    else {
      if ((src->supports & 0xc0) != 0) {
        zVar1 = _zip_source_call(src,(void *)0x0,0,ZIP_SOURCE_TELL);
        return zVar1;
      }
      if (-1 < (long)src->bytes_read) {
        return src->bytes_read;
      }
      ze = 0x1e;
      se = 0x4b;
    }
    zip_error_set(&src->error,ze,se);
  }
  return -1;
}

Assistant:

ZIP_EXTERN zip_int64_t
zip_source_tell(zip_source_t *src) {
    if (src->source_closed) {
        return -1;
    }
    if (!ZIP_SOURCE_IS_OPEN_READING(src)) {
        zip_error_set(&src->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    if ((src->supports & (ZIP_SOURCE_MAKE_COMMAND_BITMASK(ZIP_SOURCE_TELL) | ZIP_SOURCE_MAKE_COMMAND_BITMASK(ZIP_SOURCE_SEEK))) == 0) {
        if (src->bytes_read > ZIP_INT64_MAX) {
            zip_error_set(&src->error, ZIP_ER_TELL, EOVERFLOW);
            return -1;
        }
        return (zip_int64_t)src->bytes_read;
    }

    return _zip_source_call(src, NULL, 0, ZIP_SOURCE_TELL);
}